

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathLocationSetFilter
               (xmlXPathParserContextPtr ctxt,xmlLocationSetPtr locset,int filterOpIndex,int minPos,
               int maxPos)

{
  xmlXPathContextPtr pxVar1;
  xmlXPathStepOp *pxVar2;
  xmlNodePtr pxVar3;
  xmlDocPtr pxVar4;
  xmlNodePtr pxVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlXPathObjectPtr *ppxVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  
  if ((locset != (xmlLocationSetPtr)0x0) && (iVar8 = locset->locNr, iVar8 != 0)) {
    pxVar1 = ctxt->context;
    pxVar4 = pxVar1->doc;
    pxVar5 = pxVar1->node;
    iVar6 = pxVar1->contextSize;
    iVar7 = pxVar1->proximityPosition;
    pxVar2 = ctxt->comp->steps;
    pxVar1->contextSize = iVar8;
    uVar11 = 0;
    iVar14 = 1;
    for (uVar12 = 1; uVar10 = uVar12 - 1, (long)uVar10 < (long)iVar8; uVar12 = uVar12 + 1) {
      pxVar3 = (xmlNodePtr)locset->locTab[uVar12 - 1]->user;
      pxVar1->node = pxVar3;
      pxVar1->proximityPosition = (int)uVar12;
      if ((pxVar3->type != XML_NAMESPACE_DECL) && (pxVar3->doc != (_xmlDoc *)0x0)) {
        pxVar1->doc = pxVar3->doc;
      }
      iVar8 = xmlXPathCompOpEvalToBoolean(ctxt,pxVar2 + filterOpIndex,1);
      if (ctxt->error != 0) break;
      if (iVar8 < 0) {
        xmlXPathErr(ctxt,7);
        break;
      }
      if (((iVar8 == 0) || (iVar14 < 1)) || (minPos < iVar14)) {
        xmlXPathFreeObject(locset->locTab[uVar12 - 1]);
        locset->locTab[uVar12 - 1] = (xmlXPathObjectPtr)0x0;
        if (iVar8 != 0) goto LAB_001e00ec;
      }
      else {
        if (uVar10 != uVar11) {
          locset->locTab[(int)uVar11] = locset->locTab[uVar12 - 1];
          locset->locTab[uVar12 - 1] = (xmlXPathObjectPtr)0x0;
        }
        uVar11 = uVar11 + 1;
LAB_001e00ec:
        uVar10 = uVar12;
        if (iVar14 == minPos) break;
        iVar14 = iVar14 + 1;
      }
      iVar8 = locset->locNr;
    }
    for (lVar13 = (long)(int)uVar10; lVar13 < locset->locNr; lVar13 = lVar13 + 1) {
      xmlXPathFreeObject(locset->locTab[lVar13]);
    }
    locset->locNr = uVar11;
    if ((10 < locset->locMax) && ((int)uVar11 < (int)((uint)locset->locMax >> 1))) {
      uVar12 = 10;
      if (10 < (int)uVar11) {
        uVar12 = (ulong)uVar11;
      }
      ppxVar9 = (xmlXPathObjectPtr *)(*xmlRealloc)(locset->locTab,uVar12 * 8);
      if (ppxVar9 == (xmlXPathObjectPtr *)0x0) {
        xmlXPathPErrMemory(ctxt,"shrinking locset\n");
      }
      else {
        locset->locTab = ppxVar9;
        locset->locMax = (int)uVar12;
      }
    }
    pxVar1->doc = pxVar4;
    pxVar1->node = pxVar5;
    pxVar1->contextSize = iVar6;
    pxVar1->proximityPosition = iVar7;
  }
  return;
}

Assistant:

static void
xmlXPathLocationSetFilter(xmlXPathParserContextPtr ctxt,
		          xmlLocationSetPtr locset,
		          int filterOpIndex,
                          int minPos, int maxPos)
{
    xmlXPathContextPtr xpctxt;
    xmlNodePtr oldnode;
    xmlDocPtr olddoc;
    xmlXPathStepOpPtr filterOp;
    int oldcs, oldpp;
    int i, j, pos;

    if ((locset == NULL) || (locset->locNr == 0) || (filterOpIndex == -1))
        return;

    xpctxt = ctxt->context;
    oldnode = xpctxt->node;
    olddoc = xpctxt->doc;
    oldcs = xpctxt->contextSize;
    oldpp = xpctxt->proximityPosition;
    filterOp = &ctxt->comp->steps[filterOpIndex];

    xpctxt->contextSize = locset->locNr;

    for (i = 0, j = 0, pos = 1; i < locset->locNr; i++) {
        xmlNodePtr contextNode = locset->locTab[i]->user;
        int res;

        xpctxt->node = contextNode;
        xpctxt->proximityPosition = i + 1;

        /*
        * Also set the xpath document in case things like
        * key() are evaluated in the predicate.
        *
        * TODO: Get real doc for namespace nodes.
        */
        if ((contextNode->type != XML_NAMESPACE_DECL) &&
            (contextNode->doc != NULL))
            xpctxt->doc = contextNode->doc;

        res = xmlXPathCompOpEvalToBoolean(ctxt, filterOp, 1);

        if (ctxt->error != XPATH_EXPRESSION_OK)
            break;
        if (res < 0) {
            /* Shouldn't happen */
            xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
            break;
        }

        if ((res != 0) && ((pos >= minPos) && (pos <= maxPos))) {
            if (i != j) {
                locset->locTab[j] = locset->locTab[i];
                locset->locTab[i] = NULL;
            }

            j += 1;
        } else {
            /* Remove the entry from the initial location set. */
            xmlXPathFreeObject(locset->locTab[i]);
            locset->locTab[i] = NULL;
        }

        if (res != 0) {
            if (pos == maxPos) {
                i += 1;
                break;
            }

            pos += 1;
        }
    }

    /* Free remaining nodes. */
    for (; i < locset->locNr; i++)
        xmlXPathFreeObject(locset->locTab[i]);

    locset->locNr = j;

    /* If too many elements were removed, shrink table to preserve memory. */
    if ((locset->locMax > XML_NODESET_DEFAULT) &&
        (locset->locNr < locset->locMax / 2)) {
        xmlXPathObjectPtr *tmp;
        int locMax = locset->locNr;

        if (locMax < XML_NODESET_DEFAULT)
            locMax = XML_NODESET_DEFAULT;
        tmp = (xmlXPathObjectPtr *) xmlRealloc(locset->locTab,
                locMax * sizeof(xmlXPathObjectPtr));
        if (tmp == NULL) {
            xmlXPathPErrMemory(ctxt, "shrinking locset\n");
        } else {
            locset->locTab = tmp;
            locset->locMax = locMax;
        }
    }

    xpctxt->node = oldnode;
    xpctxt->doc = olddoc;
    xpctxt->contextSize = oldcs;
    xpctxt->proximityPosition = oldpp;
}